

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O0

parser_error parse_profile_tunnel(parser *p)

{
  wchar_t wVar1;
  void *pvVar2;
  cave_profile *c;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    wVar1 = parser_getint(p,"rnd");
    *(wchar_t *)((long)pvVar2 + 0x38) = wVar1;
    wVar1 = parser_getint(p,"chg");
    *(wchar_t *)((long)pvVar2 + 0x3c) = wVar1;
    wVar1 = parser_getint(p,"con");
    *(wchar_t *)((long)pvVar2 + 0x40) = wVar1;
    wVar1 = parser_getint(p,"pen");
    *(wchar_t *)((long)pvVar2 + 0x44) = wVar1;
    wVar1 = parser_getint(p,"jct");
    *(wchar_t *)((long)pvVar2 + 0x48) = wVar1;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_profile_tunnel(struct parser *p) {
	struct cave_profile *c = parser_priv(p);

	if (!c)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	c->tun.rnd = parser_getint(p, "rnd");
	c->tun.chg = parser_getint(p, "chg");
	c->tun.con = parser_getint(p, "con");
	c->tun.pen = parser_getint(p, "pen");
	c->tun.jct = parser_getint(p, "jct");
	return PARSE_ERROR_NONE;
}